

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall
wasm::PassRegistry::registerTestPass
          (PassRegistry *this,char *name,char *description,Creator *create)

{
  Creator *__s;
  char *__s_00;
  bool bVar1;
  mapped_type *this_00;
  allocator<char> local_121;
  key_type local_120;
  function<wasm::Pass_*()> local_100;
  allocator<char> local_d9;
  string local_d8;
  PassInfo local_b8;
  _Self local_70 [3];
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  Creator *local_28;
  Creator *create_local;
  char *description_local;
  char *name_local;
  PassRegistry *this_local;
  
  local_28 = create;
  create_local = (Creator *)description;
  description_local = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
       ::find(&this->passInfos,&local_50);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
       ::end(&this->passInfos);
  bVar1 = std::operator==(&local_30,local_70);
  if (!bVar1) {
    __assert_fail("passInfos.find(name) == passInfos.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x36,
                  "void wasm::PassRegistry::registerTestPass(const char *, const char *, Creator)");
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  __s = create_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,(char *)__s,&local_d9);
  std::function<wasm::Pass_*()>::function(&local_100,create);
  PassInfo::PassInfo(&local_b8,&local_d8,&local_100,true);
  __s_00 = description_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,__s_00,&local_121);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
            ::operator[](&this->passInfos,&local_120);
  PassInfo::operator=(this_00,&local_b8);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  PassInfo::~PassInfo(&local_b8);
  std::function<wasm::Pass_*()>::~function(&local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return;
}

Assistant:

void PassRegistry::registerTestPass(const char* name,
                                    const char* description,
                                    Creator create) {
  assert(passInfos.find(name) == passInfos.end());
  passInfos[name] = PassInfo(description, create, true);
}